

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O0

void __thiscall Server::Server(Server *this,EventLoop *loop,int threadNum,int port)

{
  int iVar1;
  element_type *this_00;
  undefined4 in_ECX;
  int *piVar2;
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  int in_stack_00000fa4;
  EventLoop *in_stack_00000fa8;
  EventLoopThreadPool *in_stack_00000fb0;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  Channel *in_stack_ffffffffffffffa0;
  
  *in_RDI = in_RSI;
  *(undefined4 *)(in_RDI + 1) = in_EDX;
  operator_new(0x48);
  EventLoopThreadPool::EventLoopThreadPool(in_stack_00000fb0,in_stack_00000fa8,in_stack_00000fa4);
  std::unique_ptr<EventLoopThreadPool,std::default_delete<EventLoopThreadPool>>::
  unique_ptr<std::default_delete<EventLoopThreadPool>,void>
            ((unique_ptr<EventLoopThreadPool,_std::default_delete<EventLoopThreadPool>_> *)
             in_stack_ffffffffffffffa0,
             (pointer)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  *(undefined1 *)(in_RDI + 3) = 0;
  iVar1 = (int)in_RDI + 0x20;
  operator_new(0xa8);
  Channel::Channel(in_stack_ffffffffffffffa0,
                   (EventLoop *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::shared_ptr<Channel>::shared_ptr<Channel,void>
            ((shared_ptr<Channel> *)in_stack_ffffffffffffffa0,
             (Channel *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  *(undefined4 *)(in_RDI + 6) = in_ECX;
  piVar2 = (int *)((long)in_RDI + 0x34);
  iVar1 = socket_bind_listen(iVar1);
  *piVar2 = iVar1;
  this_00 = std::__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x11b6b6);
  iVar1 = (int)piVar2;
  Channel::setFd(this_00,*(int *)((long)in_RDI + 0x34));
  handle_for_sigpipe();
  iVar1 = setSocketNonBlocking(iVar1);
  if (iVar1 < 0) {
    perror("set socket non block failed");
    abort();
  }
  return;
}

Assistant:

Server::Server(EventLoop* loop, int threadNum, int port)
        : loop_(loop),  //指针直接赋值地址 
        threadNum_(threadNum),
        eventLoopThreadPool_(new EventLoopThreadPool(loop_, threadNum)),
        started_(false),
        acceptChannel_(new Channel(loop_)),
        port_(port),
        listenFd_(socket_bind_listen(port_)){
            acceptChannel_->setFd(listenFd_);
            handle_for_sigpipe();
            if(setSocketNonBlocking(listenFd_)<0){
                perror("set socket non block failed");
                abort();
            }
}